

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ComparisonTestTU<char,unsigned_long>(void)

{
  if (ComparisonTestTU<char,unsigned_long>()::b1 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  if (ComparisonTestTU<char,unsigned_long>()::b2 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  if (ComparisonTestTU<char,unsigned_long>()::b3 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  if (ComparisonTestTU<char,unsigned_long>()::b4 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  if (ComparisonTestTU<char,unsigned_long>()::b5 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  if (ComparisonTestTU<char,unsigned_long>()::b6 == '\0') {
    ComparisonTestTU<char,unsigned_long>();
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}